

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::CartesianProductGenerator<const_libaom_test::CodecFactory_*,_int,_unsigned_int>::
~CartesianProductGenerator
          (CartesianProductGenerator<const_libaom_test::CodecFactory_*,_int,_unsigned_int> *this)

{
  ~CartesianProductGenerator(this);
  operator_delete(this);
  return;
}

Assistant:

~CartesianProductGenerator() override {}